

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_widgets.cpp
# Opt level: O2

bool check_max_min(Am_Value *result,Am_Object *widget,bool want_db)

{
  bool bVar1;
  uint uVar2;
  Am_Value *pAVar3;
  long mini;
  long maxi;
  ostream *poVar4;
  float minf;
  float maxf;
  Am_Value v2;
  Am_Value v1;
  
  pAVar3 = Am_Object::Get(widget,0x181,0);
  Am_Value::Am_Value(&v1,pAVar3);
  pAVar3 = Am_Object::Get(widget,0x182,0);
  Am_Value::Am_Value(&v2,pAVar3);
  if ((v1.type == v2.type) &&
     (((uVar2 = (uint)v1.type, uVar2 < 6 && ((0x2dU >> (uVar2 & 0x1f) & 1) != 0)) ||
      (v1.type == 0x8006)))) {
    if ((v1.type & 0x8006) == 2) {
      mini = Am_Value::operator_cast_to_long(&v1);
      maxi = Am_Value::operator_cast_to_long(&v2);
      bVar1 = icheck_max_min(result,mini,maxi,want_db,widget);
    }
    else if ((uVar2 == 0x8006) || (bVar1 = true, uVar2 == 5)) {
      minf = Am_Value::operator_cast_to_float(&v1);
      maxf = Am_Value::operator_cast_to_float(&v2);
      bVar1 = fcheck_max_min(result,minf,maxf,want_db,widget);
    }
    Am_Value::~Am_Value(&v2);
    Am_Value::~Am_Value(&v1);
    return bVar1;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar4 = std::operator<<(poVar4,"Am_VALUE_1 and Am_VALUE_2 of ");
  poVar4 = operator<<(poVar4,widget);
  poVar4 = std::operator<<(poVar4,
                           " must be int, long, float, double, or Am_No_Value,  and the same type, but they are "
                          );
  poVar4 = operator<<(poVar4,&v1);
  poVar4 = std::operator<<(poVar4," and ");
  poVar4 = operator<<(poVar4,&v2);
  std::endl<char,std::char_traits<char>>(poVar4);
  Am_Error();
}

Assistant:

bool
check_max_min(Am_Value result, Am_Object &widget, bool want_db)
{
  Am_Value v1 = widget.Get(Am_VALUE_1);
  Am_Value v2 = widget.Get(Am_VALUE_2);
  if (!(v1.type == v2.type &&
        (v1.type == Am_FLOAT || v1.type == Am_LONG || v1.type == Am_DOUBLE ||
         v1.type == Am_INT || v1.type == Am_NONE)))
    Am_ERRORO("Am_VALUE_1 and Am_VALUE_2 of "
                  << widget
                  << " must be int, long, float, double, or Am_No_Value, "
                     " and the same type, but they are "
                  << v1 << " and " << v2,
              widget, Am_VALUE_1);
  if (v1.type == Am_LONG || v1.type == Am_INT)
    return icheck_max_min(result, v1, v2, want_db, widget);
  else if (v1.type == Am_FLOAT || v1.type == Am_DOUBLE)
    return fcheck_max_min(result, v1, v2, want_db, widget);
  return true;
}